

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ListFields
          (GeneratedMessageReflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  bool bVar10;
  uint32 uVar11;
  int iVar12;
  LogMessage *other;
  ulong uVar13;
  long lVar14;
  iterator __position;
  pointer ppFVar15;
  long lVar16;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  Message *message_00;
  pointer ppFVar17;
  FieldDescriptor *field;
  FieldDescriptor *local_98;
  LogFinisher local_89;
  long local_88;
  ReflectionSchema *local_80;
  Message *local_78;
  uint32 *local_70;
  LogMessage local_68;
  
  ppFVar15 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar15) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar15;
  }
  if ((this->schema_).default_instance_ != message) {
    local_80 = &this->schema_;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_88 = 0;
    }
    else {
      uVar11 = ReflectionSchema::HasBitsOffset(local_80);
      local_88 = (long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar11;
    }
    local_70 = (this->schema_).has_bit_indices_;
    uVar2 = (this->schema_).oneof_case_offset_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 0x2c));
    message_00 = message;
    if (-1 < this->last_non_weak_field_index_) {
      lVar16 = -1;
      lVar14 = 0;
      local_78 = message;
      do {
        lVar5 = *(long *)(this->descriptor_ + 0x30);
        local_98 = (FieldDescriptor *)(lVar5 + lVar14);
        if (*(int *)(lVar5 + 0x4c + lVar14) == 3) {
          iVar12 = FieldSize(this,message_00,local_98);
          if (0 < iVar12) goto LAB_00316df7;
        }
        else {
          lVar6 = *(long *)(lVar5 + 0x60 + lVar14);
          if (lVar6 == 0) {
            if (local_88 == 0) {
              bVar10 = HasBit(this,message_00,local_98);
              if (bVar10) goto LAB_00316df7;
            }
            else {
              uVar3 = local_70[lVar16 + 1];
              if (uVar3 == 0xffffffff) {
                LogMessage::LogMessage
                          (&local_68,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                           ,1000);
                other = LogMessage::operator<<(&local_68,"CHECK failed: (has_bit_index) != (~0u): ")
                ;
                LogFinisher::operator=(&local_89,other);
                LogMessage::~LogMessage(&local_68);
              }
              message_00 = local_78;
              if ((*(uint *)(local_88 + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0) {
LAB_00316df7:
                __position._M_current =
                     (output->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (output->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00316e48;
                *__position._M_current = local_98;
                goto LAB_00316e41;
              }
            }
          }
          else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (long)((int)((ulong)(lVar6 - *(long *)(*(long *)(lVar6 + 0x10) + 0x40))
                                       >> 4) * -0x55555555) * 4 + (ulong)uVar2) ==
                   *(int *)(lVar5 + 0x38 + lVar14)) {
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00316e48:
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,__position,&local_98);
            }
            else {
              *__position._M_current = local_98;
LAB_00316e41:
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
            }
          }
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0xa8;
      } while (lVar16 < this->last_non_weak_field_index_);
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar11 = ReflectionSchema::GetExtensionSetOffset(local_80);
      ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message_00->super_MessageLite)._vptr_MessageLite + (ulong)uVar11),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar15 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar7) {
      uVar13 = (long)ppFVar7 - (long)ppFVar15 >> 3;
      lVar14 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar15,ppFVar7,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar7 - (long)ppFVar15 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar15,ppFVar7);
      }
      else {
        ppFVar17 = ppFVar15 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar15,ppFVar17);
        for (; ppFVar17 != ppFVar7; ppFVar17 = ppFVar17 + 1) {
          pFVar8 = ppFVar17[-1];
          pFVar9 = *ppFVar17;
          iVar12 = *(int *)(pFVar9 + 0x38);
          iVar4 = *(int *)(pFVar8 + 0x38);
          ppFVar15 = ppFVar17;
          while (iVar12 < iVar4) {
            *ppFVar15 = pFVar8;
            pFVar8 = ppFVar15[-2];
            ppFVar15 = ppFVar15 + -1;
            iVar4 = *(int *)(pFVar8 + 0x38);
          }
          *ppFVar15 = pFVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ListFields(
    const Message& message,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : NULL;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  const uint32* const oneof_case_array =
      &GetConstRefAtOffset<uint32>(message, schema_.oneof_case_offset_);
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}